

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O3

R_conflict6 * parse_scope(R_conflict6 *__return_storage_ptr__,QByteArrayView qualifiedKey)

{
  bool bVar1;
  qsizetype qVar2;
  R_conflict6 *pRVar3;
  storage_type *psVar4;
  long from;
  QByteArrayView needle;
  QByteArrayView haystack;
  QByteArrayView needle_00;
  
  psVar4 = qualifiedKey.m_data;
  from = qualifiedKey.m_size;
  needle.m_data = "QFlags<";
  needle.m_size = 7;
  bVar1 = QtPrivate::startsWith(qualifiedKey,needle);
  if (bVar1) {
    if (from == 0) {
      from = 0;
    }
    else if (psVar4[from + -1] == '>') {
      from = from + -8;
      psVar4 = psVar4 + 7;
    }
  }
  haystack.m_data = psVar4;
  haystack.m_size = from;
  needle_00.m_data = "::";
  needle_00.m_size = 2;
  qVar2 = QtPrivate::lastIndexOf(haystack,from,needle_00);
  if (qVar2 < 0) {
    pRVar3 = (R_conflict6 *)0x0;
  }
  else {
    (__return_storage_ptr__->scope).super__Optional_base<QByteArrayView,_true,_true>._M_payload.
    super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_size = qVar2;
    (__return_storage_ptr__->scope).super__Optional_base<QByteArrayView,_true,_true>._M_payload.
    super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_data = psVar4;
    psVar4 = psVar4 + qVar2 + 2;
    from = from - (qVar2 + 2);
    pRVar3 = (R_conflict6 *)CONCAT71((int7)((ulong)(qVar2 + 2) >> 8),1);
  }
  (__return_storage_ptr__->scope).super__Optional_base<QByteArrayView,_true,_true>._M_payload.
  super__Optional_payload_base<QByteArrayView>._M_engaged = SUB81(pRVar3,0);
  (__return_storage_ptr__->key).m_size = from;
  (__return_storage_ptr__->key).m_data = psVar4;
  return pRVar3;
}

Assistant:

static auto parse_scope(QByteArrayView qualifiedKey) noexcept
{
    struct R {
        std::optional<QByteArrayView> scope;
        QByteArrayView key;
    };
    if (qualifiedKey.startsWith("QFlags<") && qualifiedKey.endsWith('>'))
        qualifiedKey.slice(7, qualifiedKey.length() - 8);
    const auto scopePos = qualifiedKey.lastIndexOf("::"_L1);
    if (scopePos < 0)
        return R{std::nullopt, qualifiedKey};
    else
        return R{qualifiedKey.first(scopePos), qualifiedKey.sliced(scopePos + 2)};
}